

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O2

void ncnn::im2col_sgemm_pack1to4_int8_sse_avx2
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int *piVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  undefined1 *puVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  undefined1 *puVar22;
  ulong uVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  undefined1 (*pauVar27) [16];
  ulong uVar28;
  int iVar29;
  ulong uVar30;
  size_t _elemsize;
  long lVar31;
  undefined1 (*pauVar32) [16];
  ulong *puVar33;
  long lVar34;
  undefined1 (*pauVar35) [16];
  long lVar36;
  long lVar37;
  bool bVar38;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar39 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  long local_c8;
  undefined1 local_a8 [64];
  size_t local_68;
  ulong local_58;
  ulong local_50;
  Mat *local_48;
  ulong local_40;
  Mat *local_38;
  
  uVar1 = bottom_im2col->w;
  uVar24 = bottom_im2col->h;
  local_58 = (ulong)uVar24;
  uVar2 = bottom_im2col->c;
  uVar30 = (ulong)(int)uVar2;
  local_40 = (ulong)(uint)top_blob->c;
  local_68 = 0;
  local_a8._0_8_ = (void *)0x0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  local_a8._16_8_ = 0;
  local_a8._24_4_ = 0;
  local_a8._32_8_ = (Allocator *)0x0;
  local_a8._40_4_ = 0;
  local_a8._44_4_ = 0;
  local_a8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  uVar13 = uVar1;
  if ((long)uVar30 < 4) {
    _elemsize = 1;
    iVar14 = 1;
    uVar19 = uVar2;
    if ((int)uVar1 < 4) {
      if (1 < (int)uVar1) {
        uVar24 = uVar24 * 2;
        uVar13 = (uVar1 & 1) + 1;
      }
    }
    else {
      uVar24 = uVar24 * 4;
      uVar13 = (uVar1 & 1) + (uVar1 >> 2) + (uint)((uVar1 >> 1 & 1) != 0);
    }
  }
  else {
    _elemsize = 4;
    if ((int)uVar1 < 4) {
      if ((int)uVar1 < 2) {
        uVar19 = (uVar2 & 3) + ((uint)(uVar30 >> 2) & 0x3fffffff);
      }
      else {
        uVar24 = uVar24 * 2;
        uVar19 = (uVar2 & 3) + ((uint)(uVar30 >> 2) & 0x3fffffff);
        uVar13 = (uVar1 & 1) + 1;
      }
    }
    else {
      uVar24 = uVar24 * 4;
      uVar19 = (uVar2 & 3) + ((uint)(uVar30 >> 2) & 0x3fffffff);
      uVar13 = (uVar1 & 1) + (uVar1 >> 2) + (uint)((uVar1 >> 1 & 1) != 0);
    }
    iVar14 = 4;
  }
  local_48 = kernel;
  local_38 = top_blob;
  Mat::create((Mat *)local_a8,uVar24,uVar19,uVar13,_elemsize,iVar14,opt->workspace_allocator);
  uVar26 = 0;
  iVar17 = (int)local_58;
  iVar14 = 0;
  if (0 < iVar17) {
    iVar14 = iVar17;
  }
  uVar28 = (ulong)(int)uVar1;
  uVar21 = (ulong)(uint)((int)uVar1 >> 2);
  if ((int)uVar1 >> 2 < 1) {
    uVar21 = uVar26;
  }
  local_c8 = 3;
  for (; uVar26 != uVar21; uVar26 = uVar26 + 1) {
    puVar22 = (undefined1 *)(local_68 * uVar26 * local_a8._16_8_ + local_a8._0_8_);
    lVar31 = 2;
    lVar25 = 1;
    lVar20 = 3;
    for (uVar23 = 0; (long)(uVar23 | 3) < (long)uVar30; uVar23 = uVar23 + 4) {
      lVar34 = bottom_im2col->elemsize * bottom_im2col->cstep;
      lVar36 = lVar34 * uVar23;
      lVar37 = (long)bottom_im2col->data + local_c8;
      lVar15 = lVar34 * lVar20;
      lVar18 = lVar34 * lVar25;
      lVar34 = lVar34 * lVar31;
      iVar29 = iVar14;
      while (bVar38 = iVar29 != 0, iVar29 = iVar29 + -1, bVar38) {
        *puVar22 = *(undefined1 *)(lVar37 + -3 + lVar36);
        puVar22[1] = *(undefined1 *)(lVar37 + -3 + lVar18);
        puVar22[2] = *(undefined1 *)(lVar37 + -3 + lVar34);
        puVar22[3] = *(undefined1 *)(lVar37 + -3 + lVar15);
        puVar22[4] = *(undefined1 *)(lVar37 + -2 + lVar36);
        puVar22[5] = *(undefined1 *)(lVar37 + -2 + lVar18);
        puVar22[6] = *(undefined1 *)(lVar37 + -2 + lVar34);
        puVar22[7] = *(undefined1 *)(lVar37 + -2 + lVar15);
        puVar22[8] = *(undefined1 *)(lVar37 + -1 + lVar36);
        puVar22[9] = *(undefined1 *)(lVar37 + -1 + lVar18);
        puVar22[10] = *(undefined1 *)(lVar37 + -1 + lVar34);
        puVar22[0xb] = *(undefined1 *)(lVar37 + -1 + lVar15);
        puVar22[0xc] = *(undefined1 *)(lVar37 + lVar36);
        puVar22[0xd] = *(undefined1 *)(lVar37 + lVar18);
        puVar22[0xe] = *(undefined1 *)(lVar37 + lVar34);
        puVar22[0xf] = *(undefined1 *)(lVar37 + lVar15);
        puVar22 = puVar22 + 0x10;
        lVar37 = lVar37 + uVar28;
      }
      lVar20 = lVar20 + 4;
      lVar25 = lVar25 + 4;
      lVar31 = lVar31 + 4;
    }
    for (; (long)uVar23 < (long)uVar30; uVar23 = uVar23 + 1) {
      puVar16 = (undefined1 *)
                ((long)bottom_im2col->data +
                uVar26 * 4 + bottom_im2col->cstep * uVar23 * bottom_im2col->elemsize);
      iVar29 = iVar14;
      while (bVar38 = iVar29 != 0, iVar29 = iVar29 + -1, bVar38) {
        *puVar22 = *puVar16;
        puVar22[1] = puVar16[1];
        puVar22[2] = puVar16[2];
        puVar22[3] = puVar16[3];
        puVar22 = puVar22 + 4;
        puVar16 = puVar16 + uVar28;
      }
    }
    local_c8 = local_c8 + 4;
  }
  local_50 = uVar28 & 0xfffffffffffffffc;
  uVar24 = uVar1 >> 1 & 1;
  local_c8 = local_50 + 1;
  for (uVar26 = 0; uVar26 != uVar24; uVar26 = uVar26 + 1) {
    uVar21 = local_50 + uVar26 * 2;
    uVar23 = (ulong)(uint)((int)uVar21 >> 0x1f) << 0x20 | uVar21 & 0xffffffff;
    puVar22 = (undefined1 *)
              ((long)(((int)((long)uVar23 % 4) >> 1) + (int)((long)uVar23 / 4)) * local_68 *
               local_a8._16_8_ + local_a8._0_8_);
    lVar31 = 1;
    lVar25 = 2;
    lVar20 = 3;
    for (uVar23 = 0; (long)(uVar23 | 3) < (long)uVar30; uVar23 = uVar23 + 4) {
      lVar18 = bottom_im2col->elemsize * bottom_im2col->cstep;
      lVar15 = (long)bottom_im2col->data + local_c8;
      iVar29 = iVar14;
      while (bVar38 = iVar29 != 0, iVar29 = iVar29 + -1, bVar38) {
        *puVar22 = *(undefined1 *)(lVar15 + -1 + lVar18 * uVar23);
        puVar22[1] = *(undefined1 *)(lVar15 + -1 + lVar18 * lVar31);
        puVar22[2] = *(undefined1 *)(lVar15 + -1 + lVar18 * lVar25);
        puVar22[3] = *(undefined1 *)(lVar15 + -1 + lVar18 * lVar20);
        puVar22[4] = *(undefined1 *)(lVar15 + lVar18 * uVar23);
        puVar22[5] = *(undefined1 *)(lVar15 + lVar18 * lVar31);
        puVar22[6] = *(undefined1 *)(lVar15 + lVar18 * lVar25);
        puVar22[7] = *(undefined1 *)(lVar15 + lVar18 * lVar20);
        puVar22 = puVar22 + 8;
        lVar15 = lVar15 + uVar28;
      }
      lVar20 = lVar20 + 4;
      lVar25 = lVar25 + 4;
      lVar31 = lVar31 + 4;
    }
    for (; (long)uVar23 < (long)uVar30; uVar23 = uVar23 + 1) {
      puVar16 = (undefined1 *)
                ((long)bottom_im2col->data +
                uVar21 + bottom_im2col->cstep * uVar23 * bottom_im2col->elemsize);
      iVar29 = iVar14;
      while (bVar38 = iVar29 != 0, iVar29 = iVar29 + -1, bVar38) {
        *puVar22 = *puVar16;
        puVar22[1] = puVar16[1];
        puVar22 = puVar22 + 2;
        puVar16 = puVar16 + uVar28;
      }
    }
    local_c8 = local_c8 + 2;
  }
  for (uVar26 = (ulong)(int)((int)local_50 + uVar24 * 2); (long)uVar26 < (long)uVar28;
      uVar26 = uVar26 + 1) {
    uVar24 = (int)uVar26 >> 0x1f;
    uVar21 = (ulong)uVar24 << 0x20 | uVar26 & 0xffffffff;
    puVar22 = (undefined1 *)
              ((long)((int)((long)((ulong)uVar24 << 0x20 | uVar26 & 0xffffffff) % 2) +
                      (int)((long)uVar21 / 4) + (int)(char)((char)((long)uVar21 % 4) / '\x02')) *
               local_68 * local_a8._16_8_ + local_a8._0_8_);
    lVar31 = 1;
    lVar25 = 2;
    lVar20 = 3;
    for (uVar21 = 0; (long)(uVar21 | 3) < (long)uVar30; uVar21 = uVar21 + 4) {
      lVar18 = bottom_im2col->elemsize * bottom_im2col->cstep;
      lVar15 = (long)bottom_im2col->data + uVar26;
      iVar29 = iVar14;
      while (bVar38 = iVar29 != 0, iVar29 = iVar29 + -1, bVar38) {
        *puVar22 = *(undefined1 *)(lVar15 + lVar18 * uVar21);
        puVar22[1] = *(undefined1 *)(lVar15 + lVar18 * lVar31);
        puVar22[2] = *(undefined1 *)(lVar15 + lVar18 * lVar25);
        puVar22[3] = *(undefined1 *)(lVar15 + lVar18 * lVar20);
        puVar22 = puVar22 + 4;
        lVar15 = lVar15 + uVar28;
      }
      lVar20 = lVar20 + 4;
      lVar25 = lVar25 + 4;
      lVar31 = lVar31 + 4;
    }
    for (; (long)uVar21 < (long)uVar30; uVar21 = uVar21 + 1) {
      puVar16 = (undefined1 *)
                ((long)bottom_im2col->data +
                uVar26 + bottom_im2col->cstep * uVar21 * bottom_im2col->elemsize);
      iVar29 = iVar14;
      while (bVar38 = iVar29 != 0, iVar29 = iVar29 + -1, bVar38) {
        *puVar22 = *puVar16;
        puVar22 = puVar22 + 1;
        puVar16 = puVar16 + uVar28;
      }
    }
  }
  iVar14 = ((int)uVar2 / 4) * iVar17;
  uVar24 = ((int)uVar2 % 4) * iVar17;
  uVar26 = 0;
  uVar30 = (ulong)uVar24;
  if ((int)uVar24 < 1) {
    uVar30 = uVar26;
  }
  uVar21 = local_40 & 0xffffffff;
  if ((int)local_40 < 1) {
    uVar21 = uVar26;
  }
  for (; uVar26 != uVar21; uVar26 = uVar26 + 1) {
    pauVar27 = (undefined1 (*) [16])
               (local_38->cstep * uVar26 * local_38->elemsize + (long)local_38->data);
    for (uVar23 = 0; iVar17 = (int)uVar30, (long)(uVar23 | 3) < (long)uVar28; uVar23 = uVar23 + 4) {
      pauVar32 = (undefined1 (*) [16])((uVar23 >> 2) * local_68 * local_a8._16_8_ + local_a8._0_8_);
      pauVar35 = (undefined1 (*) [16])
                 (local_48->cstep * uVar26 * local_48->elemsize + (long)local_48->data);
      auVar39 = ZEXT1664((undefined1  [16])0x0);
      if (iVar14 < 1) {
        auVar43 = ZEXT1664((undefined1  [16])0x0);
      }
      else {
        auVar43 = ZEXT1664((undefined1  [16])0x0);
        auVar44 = ZEXT1664((undefined1  [16])0x0);
        auVar46 = ZEXT1664((undefined1  [16])0x0);
        iVar29 = iVar14;
        while( true ) {
          bVar38 = iVar29 == 0;
          iVar29 = iVar29 + -1;
          if (bVar38) break;
          auVar6 = vpmovsxbw_avx2(*pauVar32);
          auVar8 = vpermq_avx2(auVar6,0x50);
          auVar9 = vpermq_avx2(auVar6,0xfa);
          auVar7 = vpmovsxbw_avx2(*pauVar35);
          auVar10 = vpermq_avx2(auVar6,5);
          auVar11 = vpermq_avx2(auVar6,0xaf);
          auVar6 = vpmaddwd_avx2(auVar7,auVar8);
          auVar6 = vpaddd_avx2(auVar6,auVar46._0_32_);
          auVar46 = ZEXT3264(auVar6);
          auVar6 = vpmaddwd_avx2(auVar10,auVar7);
          auVar6 = vpaddd_avx2(auVar6,auVar43._0_32_);
          auVar43 = ZEXT3264(auVar6);
          auVar6 = vpmaddwd_avx2(auVar7,auVar9);
          auVar6 = vpaddd_avx2(auVar6,auVar44._0_32_);
          auVar44 = ZEXT3264(auVar6);
          auVar6 = vpmaddwd_avx2(auVar7,auVar11);
          auVar6 = vpaddd_avx2(auVar6,auVar39._0_32_);
          auVar39 = ZEXT3264(auVar6);
          pauVar32 = pauVar32 + 1;
          pauVar35 = pauVar35 + 1;
        }
        auVar6 = vphaddd_avx2(auVar46._0_32_,auVar43._0_32_);
        auVar7 = vphaddd_avx2(auVar44._0_32_,auVar39._0_32_);
        auVar6 = vpermq_avx2(auVar6,0x9c);
        auVar43 = ZEXT3264(auVar6);
        auVar6 = vpermq_avx2(auVar7,0x9c);
        auVar39 = ZEXT3264(auVar6);
      }
      auVar41 = auVar43._16_16_;
      auVar40 = auVar39._16_16_;
      lVar31 = 0;
      while( true ) {
        if (iVar17 == (int)lVar31) break;
        auVar48 = vpmovsxbw_avx(ZEXT216(*(ushort *)(*pauVar32 + lVar31 * 4)));
        auVar48 = vpshuflw_avx(auVar48,0x50);
        auVar42 = vpshufd_avx(auVar48,0x50);
        auVar48 = vpmovsxbw_avx(ZEXT216(*(ushort *)(*pauVar32 + lVar31 * 4 + 2)));
        auVar48 = vpshuflw_avx(auVar48,0x50);
        auVar45 = vpshufd_avx(auVar48,0x50);
        auVar48 = vpmovsxbw_avx(ZEXT416(*(uint *)(*pauVar35 + lVar31 * 4)));
        auVar48._8_8_ = auVar48._0_8_;
        auVar3 = vpmullw_avx(auVar48,auVar42);
        auVar42 = vpmulhw_avx(auVar42,auVar48);
        auVar4 = vpmullw_avx(auVar48,auVar45);
        auVar45 = vpmulhw_avx(auVar45,auVar48);
        auVar48 = vpunpcklwd_avx(auVar3,auVar42);
        auVar48 = vpaddd_avx(auVar48,auVar43._0_16_);
        auVar43 = ZEXT1664(auVar48);
        auVar48 = vpunpckhwd_avx(auVar3,auVar42);
        auVar41 = vpaddd_avx(auVar48,auVar41);
        auVar48 = vpunpcklwd_avx(auVar4,auVar45);
        auVar48 = vpaddd_avx(auVar48,auVar39._0_16_);
        auVar39 = ZEXT1664(auVar48);
        auVar48 = vpunpckhwd_avx(auVar4,auVar45);
        auVar40 = vpaddd_avx(auVar48,auVar40);
        lVar31 = lVar31 + 1;
      }
      *pauVar27 = auVar43._0_16_;
      pauVar27[1] = auVar41;
      pauVar27[2] = auVar39._0_16_;
      pauVar27[3] = auVar40;
      pauVar27 = pauVar27 + 4;
    }
    while (uVar24 = (uint)uVar23, (int)(uVar24 | 1) < (int)uVar1) {
      pauVar32 = (undefined1 (*) [16])
                 ((((uint)(uVar23 >> 2) & 0x3fffffff) + (uint)((uVar24 >> 1 & 1) != 0)) * local_68 *
                  local_a8._16_8_ + local_a8._0_8_);
      pauVar35 = (undefined1 (*) [16])
                 (local_48->cstep * uVar26 * local_48->elemsize + (long)local_48->data);
      auVar39 = ZEXT1664((undefined1  [16])0x0);
      if (0 < iVar14) {
        auVar43 = ZEXT1664((undefined1  [16])0x0);
        iVar29 = iVar14;
        while( true ) {
          bVar38 = iVar29 == 0;
          iVar29 = iVar29 + -1;
          if (bVar38) break;
          auVar6 = vpmovsxbw_avx2(*pauVar32);
          auVar7 = vpmovsxbw_avx2(*pauVar35);
          auVar8 = vpermq_avx2(auVar6,0x50);
          auVar9 = vpermq_avx2(auVar6,5);
          auVar6 = vpmaddwd_avx2(auVar8,auVar7);
          auVar6 = vpaddd_avx2(auVar6,auVar39._0_32_);
          auVar39 = ZEXT3264(auVar6);
          auVar6 = vpmaddwd_avx2(auVar9,auVar7);
          auVar6 = vpaddd_avx2(auVar6,auVar43._0_32_);
          auVar43 = ZEXT3264(auVar6);
          pauVar32 = (undefined1 (*) [16])(*pauVar32 + 8);
          pauVar35 = pauVar35 + 1;
        }
        auVar6 = vphaddd_avx2(auVar39._0_32_,auVar43._0_32_);
        auVar6 = vpermq_avx2(auVar6,0x9c);
        auVar39 = ZEXT3264(auVar6);
      }
      auVar41 = auVar39._16_16_;
      for (lVar31 = 0; iVar17 != (int)lVar31; lVar31 = lVar31 + 1) {
        auVar40 = vpmovsxbw_avx(ZEXT216(*(ushort *)(*pauVar32 + lVar31 * 2)));
        auVar40 = vpshuflw_avx(auVar40,0x50);
        auVar48 = vpshufd_avx(auVar40,0x50);
        auVar40._8_8_ = 0;
        auVar40._0_8_ = *(ulong *)(*pauVar35 + lVar31 * 4);
        auVar40 = vpmovsxbw_avx(auVar40);
        auVar45._0_8_ = auVar40._0_8_;
        auVar45._8_8_ = auVar45._0_8_;
        auVar42 = vpmullw_avx(auVar48,auVar45);
        auVar48 = vpmulhw_avx(auVar48,auVar45);
        auVar40 = vpunpcklwd_avx(auVar42,auVar48);
        auVar40 = vpaddd_avx(auVar40,auVar39._0_16_);
        auVar39 = ZEXT1664(auVar40);
        auVar40 = vpunpckhwd_avx(auVar42,auVar48);
        auVar41 = vpaddd_avx(auVar40,auVar41);
      }
      *pauVar27 = auVar39._0_16_;
      pauVar27[1] = auVar41;
      pauVar27 = pauVar27 + 2;
      uVar23 = (ulong)(uVar24 + 2);
    }
    while (uVar24 = (uint)uVar23, (int)uVar24 < (int)uVar1) {
      puVar33 = (ulong *)(((uVar24 & 1) + ((uint)(uVar23 >> 2) & 0x3fffffff) +
                          (uint)((uVar24 >> 1 & 1) != 0)) * local_68 * local_a8._16_8_ +
                         local_a8._0_8_);
      pauVar32 = (undefined1 (*) [16])
                 (local_48->cstep * uVar26 * local_48->elemsize + (long)local_48->data);
      auVar39 = ZEXT1664((undefined1  [16])0x0);
      if (0 < iVar14) {
        auVar43 = ZEXT1664((undefined1  [16])0x0);
        auVar44 = ZEXT1664((undefined1  [16])0x0);
        auVar46 = ZEXT1664((undefined1  [16])0x0);
        iVar29 = iVar14;
        while( true ) {
          bVar38 = iVar29 == 0;
          iVar29 = iVar29 + -1;
          auVar41 = auVar39._0_16_;
          auVar40 = auVar43._0_16_;
          auVar48 = auVar44._0_16_;
          auVar42 = auVar46._0_16_;
          if (bVar38) break;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *puVar33;
          auVar4 = vpmovsxbw_avx(auVar3);
          auVar45 = *pauVar32;
          auVar3 = vpcmpgtb_avx((undefined1  [16])0x0,auVar45);
          auVar5 = vpunpcklbw_avx(auVar45,auVar3);
          auVar3 = vpunpckhbw_avx(auVar45,auVar3);
          auVar47._0_8_ = auVar4._0_8_;
          auVar47._8_8_ = auVar47._0_8_;
          auVar4 = vpmullw_avx(auVar5,auVar47);
          auVar45 = vpmulhw_avx(auVar5,auVar47);
          auVar5 = vpmullw_avx(auVar47,auVar3);
          auVar3 = vpmulhw_avx(auVar47,auVar3);
          auVar47 = vpunpcklwd_avx(auVar4,auVar45);
          auVar41 = vpaddd_avx(auVar41,auVar47);
          auVar39 = ZEXT1664(auVar41);
          auVar41 = vpunpckhwd_avx(auVar4,auVar45);
          auVar41 = vpaddd_avx(auVar40,auVar41);
          auVar43 = ZEXT1664(auVar41);
          auVar41 = vpunpcklwd_avx(auVar5,auVar3);
          auVar41 = vpaddd_avx(auVar48,auVar41);
          auVar44 = ZEXT1664(auVar41);
          auVar41 = vpunpckhwd_avx(auVar5,auVar3);
          auVar41 = vpaddd_avx(auVar42,auVar41);
          auVar46 = ZEXT1664(auVar41);
          puVar33 = (ulong *)((long)puVar33 + 4);
          pauVar32 = pauVar32 + 1;
        }
        auVar45 = vpunpckldq_avx(auVar41,auVar40);
        auVar3 = vpunpckldq_avx(auVar48,auVar42);
        auVar40 = vpunpckhdq_avx(auVar41,auVar40);
        auVar48 = vpunpckhdq_avx(auVar48,auVar42);
        auVar42 = vpunpcklqdq_avx(auVar45,auVar3);
        auVar41 = vpunpckhqdq_avx(auVar45,auVar3);
        auVar41 = vpaddd_avx(auVar42,auVar41);
        auVar42 = vpunpcklqdq_avx(auVar40,auVar48);
        auVar40 = vpunpckhqdq_avx(auVar40,auVar48);
        auVar40 = vpaddd_avx(auVar40,auVar42);
        auVar41 = vpaddd_avx(auVar41,auVar40);
        auVar39 = ZEXT1664(auVar41);
      }
      for (lVar31 = 0; iVar17 != (int)lVar31; lVar31 = lVar31 + 1) {
        auVar42._0_2_ = (short)*(char *)((long)puVar33 + lVar31);
        auVar42._2_2_ = auVar42._0_2_;
        auVar42._4_2_ = auVar42._0_2_;
        auVar42._6_2_ = auVar42._0_2_;
        auVar42._8_2_ = auVar42._0_2_;
        auVar42._10_2_ = auVar42._0_2_;
        auVar42._12_2_ = auVar42._0_2_;
        auVar42._14_2_ = auVar42._0_2_;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = *(ulong *)(*pauVar32 + lVar31 * 4);
        auVar41 = vpmovsxbw_avx(auVar41);
        auVar40 = vpmullw_avx(auVar42,auVar41);
        auVar41 = vpmulhw_avx(auVar42,auVar41);
        auVar41 = vpunpcklwd_avx(auVar40,auVar41);
        auVar41 = vpaddd_avx(auVar39._0_16_,auVar41);
        auVar39 = ZEXT1664(auVar41);
      }
      *pauVar27 = auVar39._0_16_;
      pauVar27 = pauVar27 + 1;
      uVar23 = (ulong)(uVar24 + 1);
    }
  }
  piVar12 = (int *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
  if (piVar12 != (int *)0x0) {
    LOCK();
    *piVar12 = *piVar12 + -1;
    UNLOCK();
    if (*piVar12 == 0) {
      if ((Allocator *)local_a8._32_8_ == (Allocator *)0x0) {
        free((void *)local_a8._0_8_);
      }
      else {
        (*(*(_func_int ***)local_a8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void im2col_sgemm_pack1to4_int8_sse_avx2(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack1to4_int8_sse(bottom_im2col, top_blob, kernel, opt);
}